

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzmaEnc.cpp
# Opt level: O2

void crnlib::FillAlignPrices(CLzmaEnc *p)

{
  UInt32 UVar1;
  long lVar2;
  
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
    UVar1 = RcTree_ReverseGetPrice(p->posAlignEncoder,4,(UInt32)lVar2,p->ProbPrices);
    p->alignPrices[lVar2] = UVar1;
  }
  p->alignPriceCount = 0;
  return;
}

Assistant:

static void FillAlignPrices(CLzmaEnc* p) {
  UInt32 i;
  for (i = 0; i < kAlignTableSize; i++)
    p->alignPrices[i] = RcTree_ReverseGetPrice(p->posAlignEncoder, kNumAlignBits, i, p->ProbPrices);
  p->alignPriceCount = 0;
}